

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O3

void __thiscall
wasm::ShellExternalInterface::importGlobals
          (ShellExternalInterface *this,
          map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
          *globals,Module *wasm)

{
  pointer puVar1;
  Global *import_00;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *import;
  pointer puVar2;
  anon_class_16_2_d56293dd local_30;
  
  puVar2 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    local_30.this = this;
    local_30.globals = globals;
    do {
      import_00 = (puVar2->_M_t).
                  super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                  super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(import_00->super_Importable).module + 8) != (char *)0x0) {
        importGlobals::anon_class_16_2_d56293dd::operator()(&local_30,import_00);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  return;
}

Assistant:

void importGlobals(std::map<Name, Literals>& globals, Module& wasm) override {
    ModuleUtils::iterImportedGlobals(wasm, [&](Global* import) {
      auto inst = getImportInstance(import);
      auto* exportedGlobal = inst->wasm.getExportOrNull(import->base);
      if (!exportedGlobal) {
        Fatal() << "importGlobals: unknown import: " << import->module.str
                << "." << import->name.str;
      }
      globals[import->name] = inst->globals[exportedGlobal->value];
    });
  }